

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhandler.cc
# Opt level: O0

int __thiscall
BdCallback::dhtValueCallback(BdCallback *this,bdNodeId *id,string *key,uint32_t status)

{
  BitDhtHandler *pBVar1;
  int iVar2;
  string local_48 [36];
  uint local_24;
  string *psStack_20;
  uint32_t status_local;
  string *key_local;
  bdNodeId *id_local;
  BdCallback *this_local;
  
  pBVar1 = this->mParent;
  local_24 = status;
  psStack_20 = key;
  key_local = (string *)id;
  id_local = (bdNodeId *)this;
  std::__cxx11::string::string(local_48,(string *)key);
  iVar2 = (*pBVar1->_vptr_BitDhtHandler[2])(pBVar1,id,local_48,(ulong)local_24);
  std::__cxx11::string::~string(local_48);
  return iVar2;
}

Assistant:

virtual int dhtValueCallback(const bdNodeId *id, std::string key, uint32_t status) {
        return mParent->ValueCallback(id, key, status);
    }